

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_Teleport
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double *pdVar1;
  double maxdist;
  uint uVar2;
  AActor *origin;
  undefined8 *puVar3;
  PClassActor *type;
  PClass *pPVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  undefined4 extraout_var_00;
  FState *val;
  VMValue *pVVar11;
  VMValue *pVVar12;
  AActor *this;
  DSpotState *this_00;
  PClassActor *type_00;
  ASpecialSpot *pAVar13;
  double *pdVar14;
  AActor *pAVar15;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  double dVar19;
  DVector3 prev;
  DVector3 tpos;
  FName local_7c;
  DVector3 local_78;
  DVector3 local_60;
  DVector3 local_48;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003da43f:
      pcVar17 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003da4a8;
    }
    origin = (AActor *)(param->field_0).field_1.a;
    if (origin != (AActor *)0x0) {
      if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar5 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
        (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
      }
      pPVar10 = (origin->super_DThinker).super_DObject.Class;
      bVar18 = pPVar10 != (PClass *)0x0;
      if (pPVar10 != pPVar4 && bVar18) {
        do {
          pPVar10 = pPVar10->ParentClass;
          bVar18 = pPVar10 != (PClass *)0x0;
          if (pPVar10 == pPVar4) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if (!bVar18) {
        pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003da4a8;
      }
    }
    pPVar4 = AActor::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003da43f;
      puVar3 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar3 != (undefined8 *)0x0) {
        if (puVar3[1] == 0) {
          uVar9 = (**(code **)*puVar3)(puVar3);
          puVar3[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar3[1];
        bVar18 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar4 && bVar18) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar18 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar4) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar18) {
          pcVar17 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003da4a8;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
              pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003da4ef:
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1379,
                            "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            iVar5 = defaultparam->Array[3].field_0.i;
          }
          else {
            if (param[3].field_0.field_3.Type != '\0') {
              pcVar17 = "(param[paramnum]).Type == REGT_INT";
              goto LAB_003da4ef;
            }
            iVar5 = param[3].field_0.i;
          }
          if ((origin->super_DThinker).super_DObject.Class == (PClass *)0x0) {
            iVar6 = (**(origin->super_DThinker).super_DObject._vptr_DObject)(origin);
            (origin->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar6)
            ;
          }
          val = FStateLabelStorage::GetState
                          (&StateLabels,iVar5,
                           (PClassActor *)(origin->super_DThinker).super_DObject.Class,false);
          if (numparam < 5) {
            pVVar12 = defaultparam->Array;
            if ((pVVar12[4].field_0.field_3.Type != '\x03') ||
               ((pVVar11 = pVVar12 + 4, pVVar12[4].field_0.field_1.atag != 1 &&
                ((pVVar11->field_0).field_1.a != (void *)0x0)))) {
              pcVar17 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003da461;
            }
          }
          else if ((param[4].field_0.field_3.Type != '\x03') ||
                  ((pVVar11 = param + 4, param[4].field_0.field_1.atag != 1 &&
                   ((pVVar11->field_0).field_1.a != (void *)0x0)))) {
            pcVar17 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003da461:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x137a,
                          "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          type_00 = (PClassActor *)(pVVar11->field_0).field_1.a;
          if (numparam < 6) {
            pVVar12 = defaultparam->Array;
            if ((pVVar12[5].field_0.field_3.Type != '\x03') ||
               ((pVVar11 = pVVar12 + 5, pVVar12[5].field_0.field_1.atag != 1 &&
                ((pVVar11->field_0).field_1.a != (void *)0x0)))) {
              pcVar17 = 
              "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
              ;
              goto LAB_003da480;
            }
          }
          else if ((param[5].field_0.field_3.Type != '\x03') ||
                  ((pVVar11 = param + 5, param[5].field_0.field_1.atag != 1 &&
                   ((pVVar11->field_0).field_1.a != (void *)0x0)))) {
            pcVar17 = 
            "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
            ;
LAB_003da480:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x137b,
                          "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          type = (PClassActor *)(pVVar11->field_0).field_1.a;
          if (numparam < 7) {
            pVVar12 = defaultparam->Array;
            if (pVVar12[6].field_0.field_3.Type != '\0') {
              pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003da50e;
            }
          }
          else {
            pVVar12 = param;
            if (param[6].field_0.field_3.Type != '\0') {
              pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003da50e:
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x137c,
                            "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          uVar2 = pVVar12[6].field_0.i;
          if (numparam < 8) {
            pVVar12 = defaultparam->Array;
            if (pVVar12[7].field_0.field_3.Type != '\x01') {
              pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003da52d;
            }
          }
          else {
            pVVar12 = param;
            if (param[7].field_0.field_3.Type != '\x01') {
              pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003da52d:
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x137d,
                            "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          dVar19 = pVVar12[7].field_0.f;
          if (numparam < 9) {
            pVVar12 = defaultparam->Array;
            if (pVVar12[8].field_0.field_3.Type != '\x01') {
              pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
              goto LAB_003da54c;
            }
          }
          else {
            pVVar12 = param;
            if (param[8].field_0.field_3.Type != '\x01') {
              pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003da54c:
              __assert_fail(pcVar17,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x137e,
                            "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          maxdist = pVVar12[8].field_0.f;
          if (numparam < 10) {
            param = defaultparam->Array;
            if (param[9].field_0.field_3.Type != '\0') {
              pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003da56b;
            }
          }
          else if (param[9].field_0.field_3.Type != '\0') {
            pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003da56b:
            __assert_fail(pcVar17,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x137f,
                          "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
          this = COPY_AAPTR(origin,param[9].field_0.i);
          if (1 < numret) {
            if (ret[1].RegType != '\0') goto LAB_003da4c0;
            *(undefined4 *)ret[1].Location = 0;
            numret = 2;
          }
          if (0 < numret) {
            VMReturn::SetPointer(ret,(void *)0x0,0);
          }
          if ((this != (AActor *)0x0) &&
             ((((this->flags2).Value & 0x80) == 0 || ((uVar2 & 0x400) != 0)))) {
            if ((uVar2 & 2) != 0) {
              iVar5 = this->health;
              iVar7 = AActor::SpawnHealth(this);
              iVar6 = 1;
              if (0xe < iVar7 + 7U) {
                iVar7 = AActor::SpawnHealth(this);
                iVar6 = iVar7 + 7;
                if (-1 < iVar7) {
                  iVar6 = iVar7;
                }
                iVar6 = iVar6 >> 3;
              }
              uVar8 = iVar5 / iVar6;
              uVar16 = 8;
              if (uVar8 < 8) {
                uVar16 = (ulong)uVar8;
              }
              uVar8 = FRandom::GenRand32(&pr_teleport);
              if (AF_AActor_A_Teleport::chance[uVar16] <= (int)(uVar8 & 0xff)) {
                return numret;
              }
            }
            this_00 = DSpotState::GetSpotState(true);
            if (this_00 != (DSpotState *)0x0) {
              if (type_00 == (PClassActor *)0x0) {
                type_00 = PClass::FindActor("BossSpot");
              }
              pAVar13 = DSpotState::GetSpotWithMinMaxDistance
                                  (this_00,type_00,(this->__Pos).X,(this->__Pos).Y,dVar19,maxdist);
              if (pAVar13 != (ASpecialSpot *)0x0) {
                if ((uVar2 >> 0xb & 1) != 0) {
                  pdVar14 = &(pAVar13->super_AActor).__Pos.Z;
                  if ((uVar2 & 0x20) == 0) {
                    pdVar14 = &(pAVar13->super_AActor).floorz;
                  }
                  dVar19 = this->Height + *pdVar14;
                  pdVar1 = &(pAVar13->super_AActor).ceilingz;
                  if (*pdVar1 <= dVar19 && dVar19 != *pdVar1) {
                    return numret;
                  }
                  if (*pdVar14 < (pAVar13->super_AActor).floorz) {
                    return numret;
                  }
                }
                local_78.X = (this->__Pos).X;
                local_78.Y = (this->__Pos).Y;
                local_78.Z = (this->__Pos).Z;
                dVar19 = (pAVar13->super_AActor).__Pos.Z;
                local_60.Z = (pAVar13->super_AActor).ceilingz;
                if ((pAVar13->super_AActor).Height + dVar19 <= local_60.Z) {
                  local_60.Z = (pAVar13->super_AActor).floorz;
                  if (local_60.Z <= dVar19) {
                    local_60.Z = local_60.Z + (dVar19 - local_60.Z);
                  }
                }
                else {
                  local_60.Z = local_60.Z - this->Height;
                }
                local_60.X = (pAVar13->super_AActor).__Pos.X;
                local_60.Y = (pAVar13->super_AActor).__Pos.Y;
                bVar18 = P_TeleportMove(this,&local_60,(bool)((byte)uVar2 & 1),true);
                if ((!bVar18) && ((uVar2 & 4) != 0)) {
                  AActor::SetOrigin(this,local_60.X,local_60.Y,local_60.Z,false);
                  bVar18 = true;
                }
                if (bVar18 != false) {
                  if ((type != (PClassActor *)0x0) || ((uVar2 & 0x100) != 0)) {
                    if ((uVar2 & 0x40) == 0) {
                      if ((uVar2 >> 8 & 1) == 0) {
                        pAVar15 = AActor::StaticSpawn(type,&local_78,ALLOW_REPLACE,false);
                        if (pAVar15 != (AActor *)0x0) {
                          (pAVar15->target).field_0.p = this;
                        }
                      }
                      else {
                        P_SpawnTeleportFog(this,&local_78,true,true);
                      }
                    }
                    if (-1 < (char)(byte)uVar2) {
                      if ((uVar2 >> 8 & 1) == 0) {
                        local_48.X = (this->__Pos).X;
                        local_48.Y = (this->__Pos).Y;
                        local_48.Z = (this->__Pos).Z;
                        pAVar15 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
                        if (pAVar15 != (AActor *)0x0) {
                          (pAVar15->target).field_0.p = this;
                        }
                      }
                      else {
                        local_48.X = (this->__Pos).X;
                        local_48.Y = (this->__Pos).Y;
                        local_48.Z = (this->__Pos).Z;
                        P_SpawnTeleportFog(this,&local_48,false,true);
                      }
                    }
                  }
                  pdVar14 = &(pAVar13->super_AActor).__Pos.Z;
                  if ((uVar2 & 0x20) == 0) {
                    pdVar14 = &this->floorz;
                  }
                  (this->__Pos).Z = *pdVar14;
                  if ((uVar2 & 0x10) == 0) {
                    (this->Angles).Yaw.Degrees = (pAVar13->super_AActor).Angles.Yaw.Degrees;
                  }
                  if ((uVar2 & 8) == 0) {
                    (this->Vel).X = 0.0;
                    (this->Vel).Y = 0.0;
                    (this->Vel).Z = 0.0;
                  }
                  if ((uVar2 >> 9 & 1) == 0) {
                    if (val == (FState *)0x0) {
                      local_7c.Index =
                           FName::NameManager::FindName(&FName::NameData,"Teleport",false);
                      val = AActor::FindState(origin,&local_7c);
                      if (val == (FState *)0x0) {
                        return numret;
                      }
                    }
                    if (numret < 1) {
                      return numret;
                    }
                    VMReturn::SetPointer(ret,val,0);
                    return numret;
                  }
                }
                if (1 < numret) {
                  if (ret[1].RegType != '\0') {
LAB_003da4c0:
                    __assert_fail("RegType == REGT_INT",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                  ,0x13f,"void VMReturn::SetInt(int)");
                  }
                  *(uint *)ret[1].Location = (uint)bVar18;
                }
              }
            }
          }
          return numret;
        }
        pcVar17 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003da4a8;
      }
    }
  }
  pcVar17 = "(paramnum) < numparam";
LAB_003da4a8:
  __assert_fail(pcVar17,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1378,
                "int AF_AActor_A_Teleport(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Teleport)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_STATE_DEF		(teleport_state)			
	PARAM_CLASS_DEF		(target_type, ASpecialSpot)	
	PARAM_CLASS_DEF		(fog_type, AActor)			
	PARAM_INT_DEF		(flags)						
	PARAM_FLOAT_DEF		(mindist)					
	PARAM_FLOAT_DEF		(maxdist)					
	PARAM_INT_DEF		(ptr)						

	AActor *ref = COPY_AAPTR(self, ptr);

	// A_Teleport and A_Warp were the only codepointers that can state jump
	// *AND* have a meaningful inventory state chain result. Grrr.
	if (numret > 1)
	{
		ret[1].SetInt(false);
		numret = 2;
	}
	if (numret > 0)
	{
		ret[0].SetPointer(NULL, ATAG_STATE);
	}

	if (!ref)
	{
		return numret;
	}

	if ((ref->flags2 & MF2_NOTELEPORT) && !(flags & TF_OVERRIDE))
	{
		return numret;
	}

	// Randomly choose not to teleport like A_Srcr2Decide.
	if (flags & TF_RANDOMDECIDE)
	{
		static const int chance[] =
		{
			192, 120, 120, 120, 64, 64, 32, 16, 0
		};

		unsigned int chanceindex = ref->health / ((ref->SpawnHealth()/8 == 0) ? 1 : ref->SpawnHealth()/8);

		if (chanceindex >= countof(chance))
		{
			chanceindex = countof(chance) - 1;
		}

		if (pr_teleport() >= chance[chanceindex])
		{
			return numret;
		}
	}

	DSpotState *state = DSpotState::GetSpotState();
	if (state == NULL)
	{
		return numret;
	}

	if (target_type == NULL)
	{
		target_type = PClass::FindActor("BossSpot");
	}

	AActor *spot = state->GetSpotWithMinMaxDistance(target_type, ref->X(), ref->Y(), mindist, maxdist);
	if (spot == NULL)
	{
		return numret;
	}

	// [MC] By default, the function adjusts the actor's Z if it's below the floor or above the ceiling.
	// This can be an issue as actors designed to maintain specific z positions wind up teleporting
	// anyway when they should not, such as a floor rising above or ceiling lowering below the position
	// of the spot.
	if (flags & TF_SENSITIVEZ)
	{
		double posz = (flags & TF_USESPOTZ) ? spot->Z() : spot->floorz;
		if ((posz + ref->Height > spot->ceilingz) || (posz < spot->floorz))
		{
			return numret;
		}
	}
	DVector3 prev = ref->Pos();
	double aboveFloor = spot->Z() - spot->floorz;
	double finalz = spot->floorz + aboveFloor;

	if (spot->Top() > spot->ceilingz)
		finalz = spot->ceilingz - ref->Height;
	else if (spot->Z() < spot->floorz)
		finalz = spot->floorz;

	DVector3 tpos = spot->PosAtZ(finalz);

	//Take precedence and cooperate with telefragging first.
	bool tele_result = P_TeleportMove(ref, tpos, !!(flags & TF_TELEFRAG));

	if (!tele_result && (flags & TF_FORCED))
	{
		//If for some reason the original move didn't work, regardless of telefrag, force it to move.
		ref->SetOrigin(tpos, false);
		tele_result = true;
	}

	AActor *fog1 = NULL, *fog2 = NULL;
	if (tele_result)
	{
		//If a fog type is defined in the parameter, or the user wants to use the actor's predefined fogs,
		//and if there's no desire to be fogless, spawn a fog based upon settings.
		if (fog_type || (flags & TF_USEACTORFOG))
		{ 
			if (!(flags & TF_NOSRCFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, prev, true, true);
				else
				{
					fog1 = Spawn(fog_type, prev, ALLOW_REPLACE);
					if (fog1 != NULL)
						fog1->target = ref;
				}
			}
			if (!(flags & TF_NODESTFOG))
			{
				if (flags & TF_USEACTORFOG)
					P_SpawnTeleportFog(ref, ref->Pos(), false, true);
				else
				{
					fog2 = Spawn(fog_type, ref->Pos(), ALLOW_REPLACE);
					if (fog2 != NULL)
						fog2->target = ref;
				}
			}
		}
		
		ref->SetZ((flags & TF_USESPOTZ) ? spot->Z() : ref->floorz, false);

		if (!(flags & TF_KEEPANGLE))
			ref->Angles.Yaw = spot->Angles.Yaw;

		if (!(flags & TF_KEEPVELOCITY)) ref->Vel.Zero();

		if (!(flags & TF_NOJUMP)) //The state jump should only happen with the calling actor.
		{
			if (teleport_state == NULL)
			{
				// Default to Teleport.
				teleport_state = self->FindState("Teleport");
				// If still nothing, then return.
				if (teleport_state == NULL)
				{
					return numret;
				}
			}
			if (numret > 0)
			{
				ret[0].SetPointer(teleport_state, ATAG_STATE);
			}
			return numret;
		}
	}
	if (numret > 1)
	{
		ret[1].SetInt(tele_result);
	}
	return numret;
}